

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

int GetLargeValue(VP8BitReader *br,uint8_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  
  iVar1 = VP8GetBit(br,(uint)p[3]);
  if (iVar1 == 0) {
    iVar1 = VP8GetBit(br,(uint)p[4]);
    if (iVar1 == 0) {
      iVar1 = 2;
    }
    else {
      iVar1 = VP8GetBit(br,(uint)p[5]);
      iVar1 = iVar1 + 3;
    }
  }
  else {
    iVar1 = VP8GetBit(br,(uint)p[6]);
    if (iVar1 == 0) {
      iVar1 = VP8GetBit(br,(uint)p[7]);
      if (iVar1 == 0) {
        iVar1 = VP8GetBit(br,0x9f);
        iVar1 = iVar1 + 5;
      }
      else {
        iVar1 = VP8GetBit(br,0xa5);
        iVar3 = VP8GetBit(br,0x91);
        iVar1 = iVar3 + iVar1 * 2 + 7;
      }
    }
    else {
      uVar2 = VP8GetBit(br,(uint)p[8]);
      iVar1 = VP8GetBit(br,(uint)p[(ulong)uVar2 + 9]);
      uVar2 = iVar1 + uVar2 * 2;
      iVar1 = 0;
      for (pbVar4 = kCat3456_rel + *(int *)(kCat3456_rel + (ulong)uVar2 * 4); *pbVar4 != 0;
          pbVar4 = pbVar4 + 1) {
        iVar3 = VP8GetBit(br,(uint)*pbVar4);
        iVar1 = iVar3 + iVar1 * 2;
      }
      iVar1 = (8 << ((byte)uVar2 & 0x1f)) + iVar1 + 3;
    }
  }
  return iVar1;
}

Assistant:

static int GetLargeValue(VP8BitReader* const br, const uint8_t* const p) {
  int v;
  if (!VP8GetBit(br, p[3], "coeffs")) {
    if (!VP8GetBit(br, p[4], "coeffs")) {
      v = 2;
    } else {
      v = 3 + VP8GetBit(br, p[5], "coeffs");
    }
  } else {
    if (!VP8GetBit(br, p[6], "coeffs")) {
      if (!VP8GetBit(br, p[7], "coeffs")) {
        v = 5 + VP8GetBit(br, 159, "coeffs");
      } else {
        v = 7 + 2 * VP8GetBit(br, 165, "coeffs");
        v += VP8GetBit(br, 145, "coeffs");
      }
    } else {
      const uint8_t* tab;
      const int bit1 = VP8GetBit(br, p[8], "coeffs");
      const int bit0 = VP8GetBit(br, p[9 + bit1], "coeffs");
      const int cat = 2 * bit1 + bit0;
      v = 0;
      for (tab = kCat3456[cat]; *tab; ++tab) {
        v += v + VP8GetBit(br, *tab, "coeffs");
      }
      v += 3 + (8 << cat);
    }
  }
  return v;
}